

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::
boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::update_rule(boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *this)

{
  size_t sVar1;
  size_t sVar2;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *this_00;
  const_reference pvVar3;
  int __c;
  char *in_RSI;
  boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_RDI;
  
  sVar1 = in_RDI->current_;
  sVar2 = size((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)0x166360);
  if (sVar1 != sVar2) {
    this_00 = (vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               *)index(in_RDI,in_RSI,__c);
    pvVar3 = std::
             vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             ::operator[](this_00,in_RDI->current_);
    boundary_point<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::rule(&in_RDI->value_,pvVar3->rule);
  }
  return;
}

Assistant:

void update_rule()
                    {
                        if(current_ != size()) {
                            value_.rule(index()[current_].rule);
                        }
                    }